

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O3

shared_ptr<cppnet::Timer> cppnet::MakeTimer1Sec(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<cppnet::Timer> sVar1;
  undefined1 local_31;
  TIME_UNIT local_30 [2];
  element_type local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  void *local_18;
  
  local_18 = (void *)0x0;
  local_30[1] = 1;
  local_30[0] = TU_SECOND;
  local_28._vptr_Timer = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cppnet::TimerContainer,std::allocator<cppnet::TimerContainer>,decltype(nullptr),cppnet::TIME_UNIT,cppnet::TIME_UNIT>
            (&_Stack_20,(TimerContainer **)&local_28,(allocator<cppnet::TimerContainer> *)&local_31,
             &local_18,local_30 + 1,local_30);
  in_RDI->_vptr_Timer = local_28._vptr_Timer;
  in_RDI[1]._vptr_Timer = (_func_int **)_Stack_20._M_pi;
  sVar1.super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<cppnet::Timer>)
         sVar1.super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Timer> MakeTimer1Sec() {
    return std::make_shared<TimerContainer>(nullptr, TU_MILLISECOND, TU_SECOND);
}